

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O2

uint64_t __thiscall leveldb::anon_unknown_2::FileState::Size(FileState *this)

{
  uint64_t uVar1;
  
  std::mutex::lock(&(this->blocks_mutex_).mu_);
  uVar1 = this->size_;
  pthread_mutex_unlock((pthread_mutex_t *)&this->blocks_mutex_);
  return uVar1;
}

Assistant:

uint64_t Size() const {
    MutexLock lock(&blocks_mutex_);
    return size_;
  }